

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::rehash(raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         *this,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  Layout LVar5;
  
  if (n != 0 || this->capacity_ != 0) {
    uVar1 = this->size_;
    if (n == 0 && uVar1 == 0) {
      sVar2 = this->capacity_;
      if (sVar2 != 0) {
        lVar3 = 0;
        sVar4 = 0;
        do {
          if (-1 < this->ctrl_[sVar4]) {
            __gnu_cxx::new_allocator<Person>::destroy<Person>
                      ((new_allocator<Person> *)&this->settings_,
                       (Person *)((long)&(this->slots_->_first)._M_dataplus._M_p + lVar3));
          }
          sVar4 = sVar4 + 1;
          lVar3 = lVar3 + 0x48;
        } while (sVar2 != sVar4);
        LVar5 = MakeLayout(this->capacity_);
        Deallocate<8ul,std::allocator<Person>>
                  ((allocator<Person> *)&this->settings_,this->ctrl_,
                   (LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[0] + 7 &
                   0xfffffffffffffff8) +
                   LVar5.super_LayoutType<sizeof___(Ts),_signed_char,_Person>.size_[1] * 0x48);
        this->ctrl_ = EmptyGroup<std::is_same<std::allocator<Person>,std::allocator<Person>>>()::
                      empty_group;
        (this->settings_).
        super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
        .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
        this->slots_ = (slot_type *)0x0;
        this->size_ = 0;
        this->capacity_ = 0;
      }
      return;
    }
    if (uVar1 <= n) {
      uVar1 = n;
    }
    lVar3 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar2 = 1;
    if (uVar1 != 0) {
      sVar2 = 0xffffffffffffffff >> (~(byte)lVar3 & 0x3f);
    }
    if ((n == 0) || (this->capacity_ < sVar2)) {
      resize(this,sVar2);
      return;
    }
  }
  return;
}

Assistant:

void rehash(size_t n) {
        if (n == 0 && capacity_ == 0) return;
        if (n == 0 && size_ == 0) {
            destroy_slots();
            infoz_.RecordStorageChanged(0, 0);
            return;
        }
        // bitor is a faster way of doing `max` here. We will round up to the next
        // power-of-2-minus-1, so bitor is good enough.
        auto m = NormalizeCapacity((std::max)(n, size()));
        // n == 0 unconditionally rehashes as per the standard.
        if (n == 0 || m > capacity_) {
            resize(m);
        }
    }